

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::LicenseAccess::ShowSystemId(LicenseAccess *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar *buffer;
  byte *pbVar6;
  uint local_358 [2];
  uint local_350;
  uint local_348;
  uint local_340;
  uint local_338;
  uint local_330;
  uint local_328;
  uint local_320;
  uint local_318;
  uint local_310;
  uint local_308;
  uint local_300;
  uint local_2f8;
  byte local_2e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2e8;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  undefined1 *local_2c0;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined4 local_2ac;
  char *local_2a8;
  ostream *local_2a0;
  void *local_298;
  ostream *local_290;
  ostream *local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_280;
  size_t local_278;
  long local_270;
  AdsDevice *local_268;
  allocator_type *local_260;
  char local_258 [8];
  char buf [38];
  string local_228 [32];
  stringstream local_208 [8];
  stringstream stream;
  ostream local_1f8 [376];
  long local_80;
  long status;
  uint32_t bytesRead;
  allocator<unsigned_char> local_61;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  ostream *os_local;
  LicenseAccess *this_local;
  
  local_260 = &local_61;
  local_268 = &this->device;
  readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  std::allocator<unsigned_char>::allocator(local_260);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0x10,local_260);
  std::allocator<unsigned_char>::~allocator(&local_61);
  status._0_4_ = 0;
  local_280 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60;
  local_278 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_280);
  buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_280);
  local_270 = AdsDevice::ReadReqEx2(local_268,0x1010004,1,local_278,buffer,(uint32_t *)&status);
  local_80 = local_270;
  if (local_270 == 0) {
    local_2e8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,3);
    local_2cc = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,2);
    local_2c8 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,1);
    local_2c4 = (uint)*pbVar6;
    local_2ac = 0;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0);
    local_2d0 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,5);
    local_2d4 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,4);
    local_2d8 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,7);
    local_2dc = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,6);
    bVar1 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,8);
    bVar2 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,9);
    bVar3 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,10);
    bVar4 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0xb);
    bVar5 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0xc);
    local_2b0 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0xd);
    local_2b4 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0xe);
    local_2b8 = (uint)*pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_2e8,0xf);
    local_2f8 = (uint)*pbVar6;
    local_300 = local_2b8;
    local_308 = local_2b4;
    local_310 = local_2b0;
    local_318 = (uint)bVar5;
    local_320 = (uint)bVar4;
    local_328 = (uint)bVar3;
    local_330 = (uint)bVar2;
    local_338 = (uint)bVar1;
    local_340 = local_2dc;
    local_348 = local_2d8;
    local_350 = local_2d4;
    local_358[0] = local_2d0;
    local_2a8 = local_258;
    local_2c0 = (undefined1 *)local_358;
    snprintf(local_2a8,0x26,"%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n"
             ,(ulong)local_2cc,(ulong)local_2c8,(ulong)local_2c4);
    std::operator<<((ostream *)
                    readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_2a8);
    local_2e9 = std::ios::good();
    this_local._4_4_ = (uint)((local_2e9 ^ 0xff) & 1);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_208);
    local_288 = std::operator<<(local_1f8,"ShowSystemId");
    local_290 = std::operator<<(local_288,"(): failed with: 0x");
    local_298 = (void *)std::ostream::operator<<(local_290,std::hex);
    local_2a0 = (ostream *)std::ostream::operator<<(local_298,local_80);
    std::operator<<(local_2a0,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_228);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::stringstream::~stringstream(local_208);
    this_local._4_4_ = 1;
  }
  stack0xfffffffffffffdd4 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return this_local._4_4_;
}

Assistant:

int LicenseAccess::ShowSystemId(std::ostream& os) const
{
    std::vector<uint8_t> readBuffer(16);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(0x01010004,
                                          0x1,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }
    char buf[38];
    snprintf(buf, sizeof(buf), "%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n"
             , readBuffer[3], readBuffer[2], readBuffer[1], readBuffer[0]
             , readBuffer[5], readBuffer[4]
             , readBuffer[7], readBuffer[6]
             , readBuffer[8], readBuffer[9]
             , readBuffer[10], readBuffer[11], readBuffer[12], readBuffer[13], readBuffer[14], readBuffer[15]
             );
    os << buf;
    return !os.good();
}